

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void init_code_block(dill_stream_conflict s)

{
  int iVar1;
  void *pvVar2;
  long in_RDI;
  
  if (init_code_block::ps == -1) {
    iVar1 = getpagesize();
    init_code_block::ps = (long)iVar1;
  }
  if (init_code_block::size < (ulong)init_code_block::ps) {
    init_code_block::size = init_code_block::ps;
  }
  pvVar2 = mmap((void *)0x0,0x1000,7,0x22,-1,0);
  **(undefined8 **)(in_RDI + 8) = pvVar2;
  if (**(long **)(in_RDI + 8) == -1) {
    perror("mmap");
  }
  *(unsigned_long *)(*(long *)(in_RDI + 8) + 0x10) =
       **(long **)(in_RDI + 8) + init_code_block::size + -0x3c;
  return;
}

Assistant:

void
init_code_block(dill_stream s)
{
    static unsigned long size = INIT_CODE_SIZE;
#ifdef USE_MMAP_CODE_SEG
#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
    static long ps = -1;
    if (ps == -1) {
        ps = (getpagesize());
    }
    if (ps > size)
        size = ps;
    s->p->code_base = (void*)mmap(0, 4096 /*INIT_CODE_SIZE*/,
                                  PROT_EXEC | PROT_READ | PROT_WRITE,
                                  MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
    if (s->p->code_base == (void*)-1)
        perror("mmap");
#else
    s->p->code_base = (void*)malloc(size);
#endif
    s->p->code_limit = ((char*)s->p->code_base) + size - END_OF_CODE_BUFFER;
}